

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O2

int __thiscall DNSResolve::HandleData(DNSResolve *this,char *recv_data)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  DNS_TYPE type;
  int iVar5;
  string *this_01;
  string *hostname_00;
  allocator local_129;
  string hostname;
  string ip;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ip_result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cname_result;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  string local_30;
  
  ip_result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cname_result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ip_result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ip_result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cname_result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cname_result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  hostname._M_dataplus._M_p = (pointer)&hostname.field_2;
  hostname._M_string_length = 0;
  hostname.field_2._M_local_buf[0] = '\0';
  bVar1 = ParseResponse(this,recv_data,&hostname,&ip_result,&cname_result);
  if (!bVar1) {
    iVar5 = -1;
    goto LAB_00117856;
  }
  std::__cxx11::string::string((string *)&ip,"",&local_129);
  if (ip_result.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      ip_result.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::_M_assign((string *)&ip);
  }
  if (ip._M_string_length == 0) {
    this_00 = &this->hostname_status_;
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::count(this_00,&hostname);
    if (sVar3 == 0) {
LAB_001177ef:
      std::__cxx11::string::string((string *)&local_50,(string *)&hostname);
      std::__cxx11::string::string((string *)&local_b0,"",&local_129);
      hostname_00 = &local_50;
      CallCallback(this,hostname_00,&local_b0);
      this_01 = &local_b0;
      goto LAB_0011783d;
    }
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](this_00,&hostname);
    if (*pmVar4 != 0) goto LAB_001177ef;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](this_00,&hostname);
    *pmVar4 = 1;
    SendRequest(this,&hostname,type);
  }
  else {
    std::__cxx11::string::string((string *)&local_70,(string *)&hostname);
    pbVar2 = LRUCache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](&this->dns_cache_,&local_70);
    std::__cxx11::string::_M_assign((string *)pbVar2);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_30,(string *)&hostname);
    std::__cxx11::string::string((string *)&local_90,(string *)&ip);
    hostname_00 = &local_30;
    CallCallback(this,hostname_00,&local_90);
    this_01 = &local_90;
LAB_0011783d:
    std::__cxx11::string::~string((string *)this_01);
    std::__cxx11::string::~string((string *)hostname_00);
  }
  std::__cxx11::string::~string((string *)&ip);
  iVar5 = 0;
LAB_00117856:
  std::__cxx11::string::~string((string *)&hostname);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cname_result);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&ip_result);
  return iVar5;
}

Assistant:

int DNSResolve::HandleData(char* recv_data)
{
    vector<string> ip_result;
    vector<string> cname_result;
    string hostname;
    if (!ParseResponse(recv_data, hostname, ip_result, cname_result))
    {
        return -1;
    }
    string ip = "";
    if (ip_result.size() > 0)
    {
        ip = ip_result[0];
    }
    if (!ip.empty())
    {
        dns_cache_[hostname] = ip;
        CallCallback(hostname, ip);
    }
    else
    {
        if (hostname_status_.count(hostname) > 0 &&
                hostname_status_[hostname] == kHostStatusFirst)
        {
            //send again
            hostname_status_[hostname] = kHostStatusSecond;
            SendRequest(hostname, kDnsTypeAAAA);
        }
        else
        {
            CallCallback(hostname, "");
        }
    }
    return 0;
}